

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsxcnd(prscxdef *ctx,prsbdef *binctx)

{
  prsndef *ppVar1;
  prscxdef *in_RSI;
  prscxdef *in_RDI;
  prsndef *n2;
  prsndef *n1;
  tokcxdef *in_stack_00000078;
  prscxdef *in_stack_ffffffffffffffb8;
  int t;
  prscxdef *in_stack_ffffffffffffffc0;
  prsndef *in_stack_ffffffffffffffc8;
  int inlist;
  prscxdef *in_stack_ffffffffffffffd0;
  prscxdef *ppVar2;
  prscxdef *ctx_00;
  prsbdef *in_stack_ffffffffffffffe8;
  
  ppVar2 = in_RDI;
  prs_cmode(in_RDI);
  ppVar1 = prsxbin(in_RSI,in_stack_ffffffffffffffe8);
  while( true ) {
    t = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    inlist = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if ((in_RDI->prscxtok->tokcxcur).toktyp != 0x56) break;
    toknext(in_stack_00000078);
    in_stack_ffffffffffffffd0 = (prscxdef *)prsxexp(in_stack_ffffffffffffffd0,inlist);
    in_stack_ffffffffffffffc8 = ppVar1;
    prsreq(in_stack_ffffffffffffffc0,t);
    in_stack_ffffffffffffffb8 = in_RDI;
    in_stack_ffffffffffffffc0 = in_RDI;
    ctx_00 = in_stack_ffffffffffffffd0;
    ppVar1 = in_stack_ffffffffffffffc8;
    prs_cmode(in_RDI);
    prsxbin(in_RSI,(prsbdef *)ppVar1);
    ppVar1 = prsnew3(ctx_00,(int)((ulong)ppVar2 >> 0x20),(prsndef *)in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8,(prsndef *)in_stack_ffffffffffffffc0);
  }
  return ppVar1;
}

Assistant:

static prsndef *prsxcnd(prscxdef *ctx, prsbdef *binctx)
{
    prsndef *n1, *n2;
    
    VARUSED(binctx);

    n1 = prsxbin(ctx, prs_cmode(ctx) ? &prsb_or_C : &prsb_or);
    for (;;)
    {
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTQUESTION) break;
        toknext(ctx->prscxtok);
        n2 = prsxexp(ctx, FALSE);
        prsreq(ctx, TOKTCOLON);
        n1 = prsnew3(ctx, TOKTQUESTION, n1, n2,
                     prsxbin(ctx, prs_cmode(ctx) ? &prsb_asi_C : &prsb_asi));
    }
    return(n1);
}